

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O3

size_t ZSTD_decompressSequences
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset,int frame)

{
  byte bVar1;
  byte bVar2;
  undefined8 uVar3;
  seq_t sequence;
  ulong uVar4;
  U32 i;
  int iVar5;
  long lVar6;
  size_t sVar7;
  byte bVar8;
  byte bVar9;
  BYTE *pBVar10;
  uint uVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  size_t sVar14;
  ulong uVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  BYTE *litPtr;
  BYTE *local_110;
  BIT_DStream_t local_108;
  ZSTD_fseState local_e0;
  ZSTD_fseState local_d0;
  ZSTD_fseState local_c0;
  ulong local_b0 [3];
  BYTE *local_98 [2];
  ZSTD_DCtx *local_88;
  size_t local_80;
  BYTE *local_78;
  BYTE *local_70;
  BYTE *local_68;
  ulong local_60;
  size_t sStack_58;
  ulong local_50;
  ulong local_48;
  void *local_40;
  BYTE *local_38;
  
  pBVar13 = (BYTE *)(maxDstSize + (long)dst);
  local_110 = dctx->litPtr;
  sVar7 = dctx->litSize;
  pBVar12 = local_110 + sVar7;
  pBVar16 = (BYTE *)dst;
  if (nbSeq != 0) {
    local_68 = (BYTE *)dctx->prefixStart;
    local_70 = (BYTE *)dctx->virtualStart;
    local_78 = (BYTE *)dctx->dictEnd;
    dctx->fseEntropy = 1;
    lVar6 = -0xc;
    do {
      *(ulong *)((long)local_98 + lVar6 * 2) =
           (ulong)*(uint *)((long)(dctx->entropy).workspace + lVar6);
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0);
    local_80 = 0xffffffffffffffec;
    if (seqSize == 0) {
      return 0xffffffffffffffec;
    }
    local_108.limitPtr = (char *)((long)seqStart + 8);
    if (seqSize < 8) {
      local_108.bitContainer = (size_t)*seqStart;
      switch(seqSize) {
      case 7:
        local_108.bitContainer =
             local_108.bitContainer | (ulong)*(byte *)((long)seqStart + 6) << 0x30;
      case 6:
        local_108.bitContainer =
             local_108.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
      case 5:
        local_108.bitContainer =
             local_108.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
      case 4:
        local_108.bitContainer =
             local_108.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
      case 3:
        local_108.bitContainer =
             local_108.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
      case 2:
        local_108.bitContainer =
             (ulong)*(byte *)((long)seqStart + 1) * 0x100 + local_108.bitContainer;
      }
      bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
      if (bVar1 == 0) {
        return 0xffffffffffffffec;
      }
      uVar11 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      local_108.bitsConsumed = (uVar11 ^ 0x1f) + (int)seqSize * -8 + 0x29;
      local_108.ptr = (char *)seqStart;
    }
    else {
      local_108.ptr = (char *)((long)seqStart + (seqSize - 8));
      local_108.bitContainer = *(size_t *)local_108.ptr;
      if (local_108.bitContainer >> 0x38 == 0) {
        return 0xffffffffffffffec;
      }
      uVar11 = 0x1f;
      bVar1 = (byte)(local_108.bitContainer >> 0x38);
      if (bVar1 != 0) {
        for (; bVar1 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      local_108.bitsConsumed = ~uVar11 + 9;
      if (0xffffffffffffff88 < seqSize) {
        return 0xffffffffffffffec;
      }
    }
    local_108.start = (char *)seqStart;
    local_98[0] = local_110 + sVar7;
    local_88 = dctx;
    ZSTD_initFseState(&local_e0,&local_108,dctx->LLTptr);
    ZSTD_initFseState(&local_d0,&local_108,dctx->OFTptr);
    ZSTD_initFseState(&local_c0,&local_108,dctx->MLTptr);
    local_98[1] = pBVar13;
    local_38 = pBVar13 + -0x20;
    local_40 = dst;
LAB_00753a0c:
    do {
      uVar4 = local_b0[1];
      bVar1 = local_e0.table[local_e0.state].nbAdditionalBits;
      local_60 = (ulong)local_e0.table[local_e0.state].baseValue;
      bVar9 = local_c0.table[local_c0.state].nbAdditionalBits;
      sVar14 = (size_t)local_c0.table[local_c0.state].baseValue;
      bVar2 = local_d0.table[local_d0.state].nbAdditionalBits;
      bVar8 = (byte)local_108.bitsConsumed;
      if (bVar2 < 2) {
        if (bVar2 != 0) {
          local_108.bitsConsumed = local_108.bitsConsumed + 1;
          lVar6 = (ulong)(local_d0.table[local_d0.state].baseValue + (uint)(local_60 == 0)) -
                  ((long)(local_108.bitContainer << (bVar8 & 0x3f)) >> 0x3f);
          if (lVar6 == 3) {
            uVar15 = (local_b0[0] - 1) + (ulong)(local_b0[0] == 1);
          }
          else {
            uVar15 = local_b0[lVar6] + (ulong)(local_b0[lVar6] == 0);
            if (lVar6 == 1) goto LAB_00753f45;
          }
          local_b0[2] = local_b0[1];
LAB_00753f45:
          local_b0[1] = local_b0[0];
          goto LAB_00753aad;
        }
        uVar15 = local_b0[1];
        if (local_60 == 0) goto LAB_00753f45;
      }
      else {
        local_108.bitsConsumed = local_108.bitsConsumed + bVar2;
        uVar15 = ((local_108.bitContainer << (bVar8 & 0x3f)) >> (-bVar2 & 0x3f)) +
                 (ulong)local_d0.table[local_d0.state].baseValue;
        local_b0[1] = local_b0[0];
        local_b0[2] = uVar4;
LAB_00753aad:
        local_b0[1] = local_b0[0];
        local_b0[0] = uVar15;
      }
      uVar4 = local_b0[0];
      if (bVar9 != 0) {
        bVar8 = (byte)local_108.bitsConsumed;
        local_108.bitsConsumed = local_108.bitsConsumed + bVar9;
        sVar14 = sVar14 + ((local_108.bitContainer << (bVar8 & 0x3f)) >> (-bVar9 & 0x3f));
      }
      if ((0x1e < (byte)(bVar9 + bVar1 + bVar2)) && (local_108.bitsConsumed < 0x41)) {
        if (local_108.ptr < local_108.limitPtr) {
          if (local_108.ptr == local_108.start) goto LAB_00753b07;
          local_48 = (ulong)local_d0.table[local_d0.state].nextState;
          uVar15 = (ulong)(uint)((int)local_108.ptr - (int)local_108.start);
          if (local_108.start <=
              (ulong *)((long)local_108.ptr - (ulong)(local_108.bitsConsumed >> 3))) {
            uVar15 = (ulong)(local_108.bitsConsumed >> 3);
          }
          local_108.bitsConsumed = local_108.bitsConsumed + (int)uVar15 * -8;
        }
        else {
          uVar15 = (ulong)(local_108.bitsConsumed >> 3);
          local_108.bitsConsumed = local_108.bitsConsumed & 7;
        }
        local_108.ptr = (char *)((long)local_108.ptr - uVar15);
        local_108.bitContainer = *(size_t *)local_108.ptr;
      }
LAB_00753b07:
      if (bVar1 != 0) {
        bVar9 = (byte)local_108.bitsConsumed;
        local_108.bitsConsumed = local_108.bitsConsumed + bVar1;
        local_60 = local_60 + ((local_108.bitContainer << (bVar9 & 0x3f)) >> (-bVar1 & 0x3f));
      }
      iVar5 = local_108.bitsConsumed + local_e0.table[local_e0.state].nbBits;
      local_e0.state =
           (ulong)((uint)(local_108.bitContainer >> (-(char)iVar5 & 0x3fU)) &
                  BIT_mask[(uint)local_e0.table[local_e0.state].nbBits]) +
           (ulong)local_e0.table[local_e0.state].nextState;
      iVar5 = iVar5 + (uint)local_c0.table[local_c0.state].nbBits;
      local_c0.state =
           (ulong)((uint)(local_108.bitContainer >> (-(char)iVar5 & 0x3fU)) &
                  BIT_mask[(uint)local_c0.table[local_c0.state].nbBits]) +
           (ulong)local_c0.table[local_c0.state].nextState;
      local_108.bitsConsumed = iVar5 + (uint)local_d0.table[local_d0.state].nbBits;
      local_d0.state =
           (ulong)((uint)(local_108.bitContainer >> (-(char)local_108.bitsConsumed & 0x3fU)) &
                  BIT_mask[(uint)local_d0.table[local_d0.state].nbBits]) +
           (ulong)local_d0.table[local_d0.state].nextState;
      sStack_58 = sVar14;
      local_50 = local_b0[0];
      pBVar12 = local_110 + local_60;
      if ((local_98[0] < pBVar12) || (uVar15 = local_60 + sVar14, local_38 < pBVar16 + uVar15)) {
        sequence.matchLength = sVar14;
        sequence.litLength = local_60;
        sequence.offset = local_b0[0];
        uVar15 = ZSTD_execSequenceEnd
                           (pBVar16,local_98[1],sequence,&local_110,local_98[0],local_68,local_70,
                            local_78);
      }
      else {
        pBVar13 = pBVar16 + local_60;
        uVar3 = *(undefined8 *)(local_110 + 8);
        *(undefined8 *)pBVar16 = *(undefined8 *)local_110;
        *(undefined8 *)(pBVar16 + 8) = uVar3;
        if (0x10 < local_60) {
          ZSTD_decompressSequences_cold_1();
        }
        pBVar10 = local_68;
        pBVar17 = pBVar13 + -uVar4;
        local_110 = pBVar12;
        if ((ulong)((long)pBVar13 - (long)local_68) < uVar4) {
          if ((ulong)((long)pBVar13 - (long)local_70) < uVar4) {
            return local_80;
          }
          lVar6 = (long)(pBVar13 + -uVar4) - (long)local_68;
          pBVar12 = local_78 + lVar6;
          if (pBVar12 + sVar14 <= local_78) {
            memmove(pBVar13,pBVar12,sVar14);
            goto LAB_00753cad;
          }
          memmove(pBVar13,pBVar12,-lVar6);
          pBVar13 = pBVar13 + -lVar6;
          sVar14 = sVar14 + lVar6;
          sStack_58 = sVar14;
          pBVar17 = pBVar10;
        }
        if (uVar4 < 0x10) {
          if (uVar4 < 8) {
            iVar5 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar4 * 4);
            *pBVar13 = *pBVar17;
            pBVar13[1] = pBVar17[1];
            pBVar13[2] = pBVar17[2];
            pBVar13[3] = pBVar17[3];
            pBVar12 = pBVar17 + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar4 * 4);
            pBVar17 = pBVar17 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar4 * 4) -
                                (long)iVar5);
            *(undefined4 *)(pBVar13 + 4) = *(undefined4 *)pBVar12;
            sVar14 = sStack_58;
          }
          else {
            *(undefined8 *)pBVar13 = *(undefined8 *)pBVar17;
          }
          if (8 < sVar14) {
            pBVar12 = pBVar17 + 8;
            pBVar10 = pBVar13 + 8;
            if ((long)pBVar10 - (long)pBVar12 < 0x10) {
              do {
                *(undefined8 *)pBVar10 = *(undefined8 *)pBVar12;
                pBVar10 = pBVar10 + 8;
                pBVar12 = pBVar12 + 8;
              } while (pBVar10 < pBVar13 + sVar14);
            }
            else {
              uVar3 = *(undefined8 *)(pBVar17 + 0x10);
              *(undefined8 *)pBVar10 = *(undefined8 *)pBVar12;
              *(undefined8 *)(pBVar13 + 0x10) = uVar3;
              if (0x18 < (long)sVar14) {
                lVar6 = 0;
                do {
                  uVar3 = *(undefined8 *)(pBVar17 + lVar6 + 0x18 + 8);
                  pBVar12 = pBVar13 + lVar6 + 0x18;
                  *(undefined8 *)pBVar12 = *(undefined8 *)(pBVar17 + lVar6 + 0x18);
                  *(undefined8 *)(pBVar12 + 8) = uVar3;
                  uVar3 = *(undefined8 *)(pBVar17 + lVar6 + 0x28 + 8);
                  *(undefined8 *)(pBVar12 + 0x10) = *(undefined8 *)(pBVar17 + lVar6 + 0x28);
                  *(undefined8 *)(pBVar12 + 0x18) = uVar3;
                  lVar6 = lVar6 + 0x20;
                } while (pBVar12 + 0x20 < pBVar13 + sVar14);
              }
            }
          }
        }
        else {
          uVar3 = *(undefined8 *)(pBVar17 + 8);
          *(undefined8 *)pBVar13 = *(undefined8 *)pBVar17;
          *(undefined8 *)(pBVar13 + 8) = uVar3;
          if (0x10 < (long)sVar14) {
            lVar6 = 0x10;
            do {
              uVar3 = *(undefined8 *)(pBVar17 + lVar6 + 8);
              pBVar12 = pBVar13 + lVar6;
              *(undefined8 *)pBVar12 = *(undefined8 *)(pBVar17 + lVar6);
              *(undefined8 *)(pBVar12 + 8) = uVar3;
              uVar3 = *(undefined8 *)(pBVar17 + lVar6 + 0x10 + 8);
              *(undefined8 *)(pBVar12 + 0x10) = *(undefined8 *)(pBVar17 + lVar6 + 0x10);
              *(undefined8 *)(pBVar12 + 0x18) = uVar3;
              lVar6 = lVar6 + 0x20;
            } while (pBVar12 + 0x20 < pBVar13 + sVar14);
          }
        }
      }
LAB_00753cad:
      if (0xffffffffffffff88 < uVar15) {
        return uVar15;
      }
      pBVar16 = pBVar16 + uVar15;
      nbSeq = nbSeq + -1;
      if (nbSeq == 0) goto LAB_00753f95;
      if (local_108.bitsConsumed < 0x41) {
        if (local_108.ptr < local_108.limitPtr) {
          if (local_108.ptr == local_108.start) goto LAB_00753a0c;
          uVar11 = (int)local_108.ptr - (int)local_108.start;
          if (local_108.start <=
              (ulong *)((long)local_108.ptr - (ulong)(local_108.bitsConsumed >> 3))) {
            uVar11 = local_108.bitsConsumed >> 3;
          }
          local_108.bitsConsumed = local_108.bitsConsumed + uVar11 * -8;
        }
        else {
          uVar11 = local_108.bitsConsumed >> 3;
          local_108.bitsConsumed = local_108.bitsConsumed & 7;
        }
        local_108.ptr = (char *)((long)local_108.ptr - (ulong)uVar11);
        local_108.bitContainer = *(size_t *)local_108.ptr;
      }
    } while( true );
  }
LAB_00753ff0:
  sVar14 = (long)pBVar12 - (long)local_110;
  sVar7 = 0xffffffffffffffba;
  if (sVar14 <= (ulong)((long)pBVar13 - (long)pBVar16)) {
    if (pBVar16 == (BYTE *)0x0) {
      pBVar16 = (BYTE *)0x0;
    }
    else {
      memcpy(pBVar16,local_110,sVar14);
      pBVar16 = pBVar16 + sVar14;
    }
    sVar7 = (long)pBVar16 - (long)dst;
  }
  return sVar7;
LAB_00753f95:
  if (local_108.bitsConsumed < 0x41) {
    if (local_108.bitsConsumed != 0x40) {
      return local_80;
    }
    if (local_108.limitPtr <= local_108.ptr) {
      return local_80;
    }
    if (local_108.ptr != local_108.start) {
      return local_80;
    }
  }
  lVar6 = 0;
  do {
    (local_88->entropy).rep[lVar6] = (U32)local_b0[lVar6];
    lVar6 = lVar6 + 1;
    pBVar12 = local_98[0];
    dst = local_40;
    pBVar13 = local_98[1];
  } while (lVar6 != 3);
  goto LAB_00753ff0;
}

Assistant:

static size_t
ZSTD_decompressSequences(ZSTD_DCtx* dctx, void* dst, size_t maxDstSize,
                   const void* seqStart, size_t seqSize, int nbSeq,
                   const ZSTD_longOffset_e isLongOffset,
                   const int frame)
{
    DEBUGLOG(5, "ZSTD_decompressSequences");
#if DYNAMIC_BMI2
    if (dctx->bmi2) {
        return ZSTD_decompressSequences_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
    }
#endif
  return ZSTD_decompressSequences_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
}